

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyRecord.cpp
# Opt level: O0

bool JsUtil::NoCaseComparer<Js::CaseInvariantPropertyListWithHashCode_*>::Equals
               (CaseInvariantPropertyListWithHashCode *list1,CharacterBuffer<char16_t> *str)

{
  code *pcVar1;
  bool bVar2;
  charcount_t len;
  undefined4 *puVar3;
  RecyclerWeakReference<const_Js::PropertyRecord> *this;
  char16 *string_00;
  undefined1 local_40 [8];
  CharacterBuffer<char16_t> string;
  PropertyRecord *prop;
  RecyclerWeakReference<const_Js::PropertyRecord> *propRecordWeakRef;
  CharacterBuffer<char16_t> *str_local;
  CaseInvariantPropertyListWithHashCode *list1_local;
  
  if (list1 == (CaseInvariantPropertyListWithHashCode *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/PropertyRecord.cpp"
                       ,0xb5,"(list1 != nullptr)","list1 != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  this = List<const_Memory::RecyclerWeakReference<const_Js::PropertyRecord>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
         ::CompactEnd<true>(&list1->
                             super_List<const_Memory::RecyclerWeakReference<const_Js::PropertyRecord>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                           );
  if (this == (RecyclerWeakReference<const_Js::PropertyRecord> *)0x0) {
    list1_local._7_1_ = false;
  }
  else {
    string._8_8_ = Memory::RecyclerWeakReference<const_Js::PropertyRecord>::Get(this);
    if ((PropertyRecord *)string._8_8_ == (PropertyRecord *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/PropertyRecord.cpp"
                         ,0xbf,"(prop)","prop");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    string_00 = Js::PropertyRecord::GetBuffer((PropertyRecord *)string._8_8_);
    len = Js::PropertyRecord::GetLength((PropertyRecord *)string._8_8_);
    CharacterBuffer<char16_t>::CharacterBuffer((CharacterBuffer<char16_t> *)local_40,string_00,len);
    list1_local._7_1_ =
         NoCaseComparer<JsUtil::CharacterBuffer<char16_t>_>::Equals
                   ((CharacterBuffer<char16_t> *)local_40,str);
  }
  return list1_local._7_1_;
}

Assistant:

bool NoCaseComparer<Js::CaseInvariantPropertyListWithHashCode*>::Equals(_In_ Js::CaseInvariantPropertyListWithHashCode* list1, JsUtil::CharacterBuffer<WCHAR> const& str)
    {
        Assert(list1 != nullptr);

        const RecyclerWeakReference<Js::PropertyRecord const>* propRecordWeakRef = list1->CompactEnd<true>();

        // If the lists are empty post-compaction, thats fine, we'll just remove them later
        if (propRecordWeakRef != nullptr)
        {
            const Js::PropertyRecord* prop = propRecordWeakRef->Get();

            // Since compaction returned this pointer, their strong refs should not be null
            Assert(prop);

            JsUtil::CharacterBuffer<WCHAR> string(prop->GetBuffer(), prop->GetLength());

            return NoCaseComparer<JsUtil::CharacterBuffer<WCHAR> >::Equals(string, str);
        }

        // If either of the property strings contains no entries, the two lists are not equivalent
        return false;
    }